

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

shared_ptr<peg::Ope> __thiscall
peg::seq<std::shared_ptr<peg::Ope>,peg::Definition&>
          (peg *this,shared_ptr<peg::Ope> *args,Definition *args_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<peg::Ope> sVar2;
  undefined1 local_49;
  Sequence *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<peg::Ope> local_38;
  shared_ptr<peg::Ope> local_28;
  WeakHolder *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_18 = (WeakHolder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::WeakHolder,std::allocator<peg::WeakHolder>,std::shared_ptr<peg::Holder>&>
            (&_Stack_10,&local_18,(allocator<peg::WeakHolder> *)&local_49,&args_1->holder_);
  local_28.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_18->super_Ope;
  local_28.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_10._M_pi;
  local_48 = (Sequence *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::Sequence,std::allocator<peg::Sequence>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            (&local_40,&local_48,(allocator<peg::Sequence> *)&local_18,&local_38,&local_28);
  _Var1._M_pi = local_40._M_pi;
  *(Sequence **)this = local_48;
  *(undefined8 *)(this + 8) = 0;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_48 = (Sequence *)0x0;
  _Var1._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> seq(Args&& ...args) {
    return std::make_shared<Sequence>(static_cast<std::shared_ptr<Ope>>(args)...);
}